

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml.cpp
# Opt level: O0

TiXmlNode * __thiscall
despot::util::tinyxml::TiXmlNode::InsertEndChild(TiXmlNode *this,TiXmlNode *addThis)

{
  int iVar1;
  TiXmlDocument *pTVar2;
  undefined4 extraout_var;
  TiXmlNode *node;
  TiXmlNode *addThis_local;
  TiXmlNode *this_local;
  
  iVar1 = Type(addThis);
  if (iVar1 == 0) {
    pTVar2 = GetDocument(this);
    if (pTVar2 != (TiXmlDocument *)0x0) {
      pTVar2 = GetDocument(this);
      TiXmlDocument::SetError
                (pTVar2,0x10,(char *)0x0,(TiXmlParsingData *)0x0,TIXML_ENCODING_UNKNOWN);
    }
    this_local = (TiXmlNode *)0x0;
  }
  else {
    iVar1 = (*(addThis->super_TiXmlBase)._vptr_TiXmlBase[0x10])();
    if ((TiXmlNode *)CONCAT44(extraout_var,iVar1) == (TiXmlNode *)0x0) {
      this_local = (TiXmlNode *)0x0;
    }
    else {
      this_local = LinkEndChild(this,(TiXmlNode *)CONCAT44(extraout_var,iVar1));
    }
  }
  return this_local;
}

Assistant:

TiXmlNode* TiXmlNode::InsertEndChild(const TiXmlNode& addThis) {
	if (addThis.Type() == TiXmlNode::DOCUMENT) {
		if (GetDocument())
			GetDocument()->SetError(TIXML_ERROR_DOCUMENT_TOP_ONLY, 0, 0,
				TIXML_ENCODING_UNKNOWN);
		return 0;
	}
	TiXmlNode* node = addThis.Clone();
	if (!node)
		return 0;

	return LinkEndChild(node);
}